

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O1

void __thiscall Snes_Spc::reset(Snes_Spc *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint8_t (*pauVar3) [16];
  
  memset((this->m).ram.ram,0xff,0x10000);
  (this->m).rom_enabled = 0;
  uVar1 = *(undefined8 *)((this->m).ram.ram + 0xf0);
  uVar2 = *(undefined8 *)((this->m).ram.ram + 0xf8);
  *(undefined8 *)(this->m).smp_regs[0] = uVar1;
  *(undefined8 *)((this->m).smp_regs[0] + 8) = uVar2;
  *(undefined8 *)(this->m).smp_regs[1] = uVar1;
  *(undefined8 *)((this->m).smp_regs[1] + 8) = uVar2;
  *(uint8_t *)((long)((this->m).smp_regs + 1) + 0) = '\0';
  *(uint8_t *)((long)((this->m).smp_regs + 1) + 1) = '\0';
  pauVar3 = (this->m).smp_regs;
  *(uint8_t *)((long)(pauVar3 + 1) + 10) = '\0';
  *(uint8_t *)((long)(pauVar3 + 1) + 0xb) = '\0';
  (this->m).smp_regs[1][0xc] = '\0';
  memset(&(this->m).ram,0xff,0x100);
  memset((this->m).ram.padding2,0xff,0x100);
  pauVar3 = (this->m).smp_regs;
  *(uint8_t *)((long)(pauVar3 + 1) + 0xd) = '\x0f';
  *(uint8_t *)((long)(pauVar3 + 1) + 0xe) = '\x0f';
  (this->m).smp_regs[1][0xf] = '\x0f';
  (this->m).cpu_regs.pc = 0;
  (this->m).cpu_regs.a = 0;
  (this->m).cpu_regs.x = 0;
  (this->m).cpu_regs.y = 0;
  (this->m).cpu_regs.psw = 0;
  (this->m).cpu_regs.sp = 0;
  (this->m).cpu_regs.pc = 0xffc0;
  *(uint8_t *)((long)((this->m).smp_regs + 0) + 0) = '\n';
  *(uint8_t *)((long)((this->m).smp_regs + 0) + 1) = 0xb0;
  pauVar3 = (this->m).smp_regs;
  *(uint8_t *)((long)(pauVar3 + 1) + 4) = '\0';
  *(uint8_t *)((long)(pauVar3 + 1) + 5) = '\0';
  *(uint8_t *)((long)(pauVar3 + 1) + 6) = '\0';
  *(uint8_t *)((long)(pauVar3 + 1) + 7) = '\0';
  reset_time_regs(this);
  Spc_Dsp::reset(&this->dsp);
  return;
}

Assistant:

void Snes_Spc::reset()
{
	memset( RAM, 0xFF, 0x10000 );
	ram_loaded();
	reset_common( 0x0F );
	dsp.reset();
}